

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_secret.cpp
# Opt level: O3

Value * duckdb::GetConstantExpressionValue(Value *__return_storage_ptr__,ParsedExpression *expr)

{
  ExpressionType EVar1;
  ConstantExpression *pCVar2;
  Value *extraout_RAX;
  ColumnRefExpression *pCVar3;
  Value *extraout_RAX_00;
  Value *extraout_RAX_01;
  Value *pVVar4;
  LogicalType LStack_48;
  undefined1 local_30 [32];
  
  EVar1 = (expr->super_BaseExpression).type;
  if (EVar1 == COLUMN_REF) {
    pCVar3 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    (*(pCVar3->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              ((string *)local_30,pCVar3);
    Value::Value(__return_storage_ptr__,(string *)local_30);
    pVVar4 = (Value *)(local_30 + 0x10);
    if ((Value *)local_30._0_8_ != pVVar4) {
      operator_delete((void *)local_30._0_8_);
      pVVar4 = extraout_RAX_00;
    }
  }
  else {
    if (EVar1 == VALUE_CONSTANT) {
      pCVar2 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
      Value::Value(__return_storage_ptr__,&pCVar2->value);
      return extraout_RAX;
    }
    LogicalType::LogicalType(&LStack_48,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_48);
    LogicalType::~LogicalType(&LStack_48);
    pVVar4 = extraout_RAX_01;
  }
  return pVVar4;
}

Assistant:

static Value GetConstantExpressionValue(ParsedExpression &expr) {
	if (expr.type == ExpressionType::VALUE_CONSTANT) {
		return expr.Cast<ConstantExpression>().value;
	}
	if (expr.type == ExpressionType::COLUMN_REF) {
		return expr.Cast<ColumnRefExpression>().GetName();
	}
	return Value();
}